

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSymmetry.cpp
# Opt level: O3

void __thiscall
HighsOrbitopeMatrix::determineOrbitopeType(HighsOrbitopeMatrix *this,HighsCliqueTable *cliquetable)

{
  HighsHashTable<int,_int> *pHVar1;
  CliqueVar CVar2;
  pointer pcVar3;
  bool bVar4;
  int iVar5;
  uint uVar6;
  ulong uVar7;
  vector<signed_char,_std::allocator<signed_char>_> *this_00;
  HighsOrbitopeMatrix *pHVar8;
  int iVar9;
  long lVar10;
  ulong uVar11;
  pair<const_HighsCliqueTable::CliqueVar_*,_int> pVar12;
  u8 meta;
  u64 pos;
  u64 maxPos;
  u64 startPos;
  u8 local_89;
  undefined8 local_88;
  CliqueVar local_7c;
  ulong local_78;
  HighsOrbitopeMatrix *local_70;
  ulong local_68;
  vector<signed_char,_std::allocator<signed_char>_> *local_60;
  pointer local_58;
  pointer local_50;
  HighsCliqueTable *local_48;
  u64 local_40;
  u64 local_38;
  
  iVar9 = this->rowLength;
  local_70 = this;
  local_48 = cliquetable;
  if (iVar9 < 1) {
    iVar5 = this->numRows;
  }
  else {
    iVar5 = this->numRows;
    lVar10 = 0;
    do {
      local_88._0_4_ = 0;
      if (0 < iVar5) {
        do {
          HighsHashTable<int,int>::insert<int&,int&>
                    ((HighsHashTable<int,int> *)&this->columnToRow,
                     (this->matrix).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start + iVar5 * lVar10 + (long)(int)local_88,
                     (int *)&local_88);
          local_88._0_4_ = (int)local_88 + 1;
          iVar5 = this->numRows;
        } while ((int)local_88 < iVar5);
        iVar9 = this->rowLength;
      }
      lVar10 = lVar10 + 1;
    } while (lVar10 < iVar9);
  }
  pHVar8 = local_70;
  this_00 = &local_70->rowIsSetPacking;
  local_88._0_4_ = CONCAT31(local_88._1_3_,0xff);
  std::vector<signed_char,_std::allocator<signed_char>_>::_M_fill_assign
            (this_00,(long)iVar5,(value_type *)&local_88);
  pHVar8->numSetPackingRows = 0;
  uVar7 = (ulong)(uint)pHVar8->numRows;
  local_60 = this_00;
  if (1 < pHVar8->rowLength) {
    pHVar1 = &pHVar8->columnToRow;
    local_78 = 1;
    iVar9 = 0;
    do {
      local_58 = (pHVar8->matrix).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start + (long)(int)uVar7 * local_78;
      local_68 = 0;
      do {
        if (0 < (int)uVar7) {
          local_50 = (pHVar8->matrix).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start + (long)(int)uVar7 * local_68;
          uVar11 = 0;
          do {
            if ((this_00->super__Vector_base<signed_char,_std::allocator<signed_char>_>)._M_impl.
                super__Vector_impl_data._M_start[uVar11] == -1) {
              pVar12 = HighsCliqueTable::findCommonClique
                                 (local_48,(CliqueVar)(local_50[uVar11] | 0x80000000),
                                  (CliqueVar)(local_58[uVar11] | 0x80000000));
              if (pVar12.first == (CliqueVar *)0x0) {
                (local_60->super__Vector_base<signed_char,_std::allocator<signed_char>_>)._M_impl.
                super__Vector_impl_data._M_start[uVar11] = '\0';
                this_00 = local_60;
              }
              else {
                if (pVar12.second < 1) {
                  iVar9 = 0;
                }
                else {
                  uVar7 = 0;
                  iVar9 = 0;
                  do {
                    CVar2 = pVar12.first[uVar7];
                    if ((int)CVar2 < 0) {
                      local_7c = (CliqueVar)((uint)CVar2 & 0x7fffffff);
                      bVar4 = HighsHashTable<int,_int>::findPosition
                                        (pHVar1,(KeyType_conflict *)&local_7c,&local_89,&local_38,
                                         &local_40,&local_88);
                      if (bVar4) {
                        iVar9 = iVar9 + (uint)(uVar11 ==
                                              (uint)*(int *)((long)((pHVar1->entries)._M_t.
                                                                                                                                        
                                                  super___uniq_ptr_impl<HighsHashTableEntry<int,_int>,_HighsHashTable<int,_int>::OpNewDeleter>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_HighsHashTableEntry<int,_int>_*,_HighsHashTable<int,_int>::OpNewDeleter>
                                                  .
                                                  super__Head_base<0UL,_HighsHashTableEntry<int,_int>_*,_false>
                                                  ._M_head_impl +
                                                  CONCAT44(local_88._4_4_,(int)local_88)) + 4));
                      }
                    }
                    uVar7 = uVar7 + 1;
                  } while ((uint)pVar12.second != uVar7);
                }
                this_00 = local_60;
                pHVar8 = local_70;
                if (iVar9 == local_70->rowLength) {
                  (local_70->rowIsSetPacking).
                  super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar11] = '\x01';
                  uVar6 = local_70->numSetPackingRows + 1;
                  uVar7 = (ulong)uVar6;
                  local_70->numSetPackingRows = uVar6;
                  if (uVar6 == local_70->numRows) goto LAB_002f887f;
                }
              }
            }
            uVar11 = uVar11 + 1;
            uVar7 = (ulong)pHVar8->numRows;
          } while ((long)uVar11 < (long)uVar7);
          iVar9 = pHVar8->numSetPackingRows;
        }
      } while ((iVar9 != (int)uVar7) && (local_68 = local_68 + 1, local_68 < local_78));
    } while ((iVar9 != (int)uVar7) &&
            (local_78 = local_78 + 1, (long)local_78 < (long)pHVar8->rowLength));
  }
LAB_002f887f:
  if (0 < (int)uVar7) {
    lVar10 = 0;
    do {
      pcVar3 = (this_00->super__Vector_base<signed_char,_std::allocator<signed_char>_>)._M_impl.
               super__Vector_impl_data._M_start;
      if (pcVar3[lVar10] == '\0') {
        pcVar3[lVar10] = -1;
        uVar7 = (ulong)(uint)pHVar8->numRows;
      }
      lVar10 = lVar10 + 1;
    } while (lVar10 < (int)uVar7);
  }
  if (1 < pHVar8->rowLength) {
    pHVar1 = &pHVar8->columnToRow;
    local_78 = 1;
    do {
      local_58 = (pHVar8->matrix).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start + (long)(int)uVar7 * local_78;
      local_68 = 0;
      do {
        if (0 < (int)uVar7) {
          local_50 = (pHVar8->matrix).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start + (long)(int)uVar7 * local_68;
          uVar11 = 0;
          do {
            if ((this_00->super__Vector_base<signed_char,_std::allocator<signed_char>_>)._M_impl.
                super__Vector_impl_data._M_start[uVar11] == -1) {
              pVar12 = HighsCliqueTable::findCommonClique
                                 (local_48,(CliqueVar)(local_50[uVar11] & 0x7fffffff),
                                  (CliqueVar)(local_58[uVar11] & 0x7fffffff));
              if (pVar12.first == (CliqueVar *)0x0) {
                (this_00->super__Vector_base<signed_char,_std::allocator<signed_char>_>)._M_impl.
                super__Vector_impl_data._M_start[uVar11] = '\0';
              }
              else {
                if (pVar12.second < 1) {
                  iVar9 = 0;
                }
                else {
                  uVar7 = 0;
                  iVar9 = 0;
                  do {
                    CVar2 = pVar12.first[uVar7];
                    if ((-1 < (int)CVar2) &&
                       (local_7c = CVar2,
                       bVar4 = HighsHashTable<int,_int>::findPosition
                                         (pHVar1,(KeyType_conflict *)&local_7c,&local_89,&local_38,
                                          &local_40,&local_88), bVar4)) {
                      iVar9 = iVar9 + (uint)(uVar11 ==
                                            (uint)*(int *)((long)((pHVar1->entries)._M_t.
                                                                                                                                    
                                                  super___uniq_ptr_impl<HighsHashTableEntry<int,_int>,_HighsHashTable<int,_int>::OpNewDeleter>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_HighsHashTableEntry<int,_int>_*,_HighsHashTable<int,_int>::OpNewDeleter>
                                                  .
                                                  super__Head_base<0UL,_HighsHashTableEntry<int,_int>_*,_false>
                                                  ._M_head_impl +
                                                  CONCAT44(local_88._4_4_,(int)local_88)) + 4));
                    }
                    uVar7 = uVar7 + 1;
                  } while ((uint)pVar12.second != uVar7);
                }
                this_00 = local_60;
                pHVar8 = local_70;
                if (iVar9 == local_70->rowLength) {
                  (local_70->rowIsSetPacking).
                  super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar11] = '\x02';
                  uVar6 = local_70->numSetPackingRows + 1;
                  uVar7 = (ulong)uVar6;
                  local_70->numSetPackingRows = uVar6;
                  if (uVar6 == local_70->numRows) break;
                }
              }
            }
            uVar11 = uVar11 + 1;
            uVar7 = (ulong)pHVar8->numRows;
          } while ((long)uVar11 < (long)uVar7);
        }
      } while ((pHVar8->numSetPackingRows != (int)uVar7) &&
              (local_68 = local_68 + 1, local_68 < local_78));
    } while ((pHVar8->numSetPackingRows != (int)uVar7) &&
            (local_78 = local_78 + 1, (long)local_78 < (long)pHVar8->rowLength));
  }
  return;
}

Assistant:

void HighsOrbitopeMatrix::determineOrbitopeType(HighsCliqueTable& cliquetable) {
  for (HighsInt j = 0; j < rowLength; ++j) {
    for (HighsInt i = 0; i < numRows; ++i) {
      columnToRow.insert(entry(i, j), i);
    }
  }

  rowIsSetPacking.assign(numRows, -1);
  numSetPackingRows = 0;

  for (HighsInt j = 1; j < rowLength; ++j) {
    HighsInt* colj1 = &entry(0, j);

    for (HighsInt j0 = 0; j0 < j; ++j0) {
      HighsInt* colj0 = &entry(0, j0);

      for (HighsInt i = 0; i < numRows; ++i) {
        if (rowIsSetPacking[i] != -1) continue;

        HighsInt xj0 = colj0[i];
        HighsInt xj1 = colj1[i];

        auto commonClique = cliquetable.findCommonClique({xj0, 1}, {xj1, 1});

        if (commonClique.first == nullptr) {
          rowIsSetPacking[i] = false;
          continue;
        }

        HighsInt overlap = 0;

        for (HighsInt k = 0; k < commonClique.second; ++k) {
          if (commonClique.first[k].val == 0) continue;

          HighsInt* cliqueColRow = columnToRow.find(commonClique.first[k].col);
          if (cliqueColRow && *cliqueColRow == i) ++overlap;
        }

        if (overlap == rowLength) {
          rowIsSetPacking[i] = true;
          ++numSetPackingRows;
          if (numSetPackingRows == numRows) break;
        }
      }

      if (numSetPackingRows == numRows) break;
    }

    if (numSetPackingRows == numRows) break;
  }

  // now for the rows that do not have a set packing structure check
  // if we have such structure when all columns in the row are negated

  for (HighsInt i = 0; i < numRows; ++i) {
    if (!rowIsSetPacking[i]) rowIsSetPacking[i] = -1;
  }

  for (HighsInt j = 1; j < rowLength; ++j) {
    HighsInt* colj1 = &entry(0, j);

    for (HighsInt j0 = 0; j0 < j; ++j0) {
      HighsInt* colj0 = &entry(0, j0);

      for (HighsInt i = 0; i < numRows; ++i) {
        if (rowIsSetPacking[i] != -1) continue;

        HighsInt xj0 = colj0[i];
        HighsInt xj1 = colj1[i];

        // now look for cliques with value 0
        auto commonClique = cliquetable.findCommonClique({xj0, 0}, {xj1, 0});

        if (commonClique.first == nullptr) {
          rowIsSetPacking[i] = false;
          continue;
        }

        HighsInt overlap = 0;

        for (HighsInt k = 0; k < commonClique.second; ++k) {
          // skip clique variables with values of 1
          if (commonClique.first[k].val == 1) continue;

          HighsInt* cliqueColRow = columnToRow.find(commonClique.first[k].col);
          if (cliqueColRow && *cliqueColRow == i) ++overlap;
        }

        if (overlap == rowLength) {
          // mark with value 2, for negated set packing row with at most one
          // zero
          rowIsSetPacking[i] = 2;
          ++numSetPackingRows;
          if (numSetPackingRows == numRows) break;
        }
      }

      if (numSetPackingRows == numRows) break;
    }

    if (numSetPackingRows == numRows) break;
  }
}